

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::makeGlobalGrid
          (TasmanianSparseGrid *this,int dimensions,int outputs,int depth,TypeDepth type,
          TypeOneDRule rule,vector<int,_std::allocator<int>_> *anisotropic_weights,double alpha,
          double beta,char *custom_filename,vector<int,_std::allocator<int>_> *level_limits)

{
  bool bVar1;
  invalid_argument *piVar2;
  size_type sVar3;
  int local_ac;
  pointer local_78;
  unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> local_70;
  size_type local_68;
  size_t expected_aw_size;
  double local_50;
  double beta_local;
  double alpha_local;
  TypeDepth local_38;
  TypeOneDRule rule_local;
  TypeDepth type_local;
  int depth_local;
  int outputs_local;
  int dimensions_local;
  TasmanianSparseGrid *this_local;
  
  local_50 = beta;
  beta_local = alpha;
  alpha_local._4_4_ = rule;
  local_38 = type;
  rule_local = depth;
  type_local = outputs;
  depth_local = dimensions;
  _outputs_local = this;
  if (dimensions < 1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar2,"ERROR: makeGlobalGrid() requires positive dimensions");
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  if (outputs < 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar2,"ERROR: makeGlobalGrid() requires non-negative outputs");
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  if (depth < 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar2,"ERROR: makeGlobalGrid() requires non-negative depth");
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  bVar1 = OneDimensionalMeta::isGlobal(rule);
  if (!bVar1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar2,"ERROR: makeGlobalGrid() requires a global rule");
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  if ((alpha_local._4_4_ == rule_customtabulated) && (custom_filename == (char *)0x0)) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar2,"ERROR: makeGlobalGrid() with custom tabulated rule requires a filename");
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  bVar1 = OneDimensionalMeta::isTypeCurved(local_38);
  if (bVar1) {
    local_ac = depth_local << 1;
  }
  else {
    local_ac = depth_local;
  }
  local_68 = (size_type)local_ac;
  bVar1 = ::std::vector<int,_std::allocator<int>_>::empty(anisotropic_weights);
  if (!bVar1) {
    sVar3 = ::std::vector<int,_std::allocator<int>_>::size(anisotropic_weights);
    if (sVar3 != local_68) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument
                (piVar2,
                 "ERROR: makeGlobalGrid() requires anisotropic_weights with either 0 or dimenions entries"
                );
      __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,
                  ::std::invalid_argument::~invalid_argument);
    }
  }
  bVar1 = ::std::vector<int,_std::allocator<int>_>::empty(level_limits);
  if (!bVar1) {
    sVar3 = ::std::vector<int,_std::allocator<int>_>::size(level_limits);
    if (sVar3 != (long)depth_local) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument
                (piVar2,
                 "ERROR: makeGlobalGrid() requires level_limits with either 0 or dimensions entries"
                );
      __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,
                  ::std::invalid_argument::~invalid_argument);
    }
  }
  clear(this);
  ::std::vector<int,_std::allocator<int>_>::operator=(&this->llimits,level_limits);
  local_78 = ::std::
             unique_ptr<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
             ::get(&this->acceleration);
  Utils::
  make_unique<TasGrid::GridGlobal,TasGrid::AccelerationContext*,int&,int&,int&,TasGrid::TypeDepth&,TasGrid::TypeOneDRule&,std::vector<int,std::allocator<int>>const&,double&,double&,char_const*&,std::vector<int,std::allocator<int>>&>
            ((Utils *)&local_70,&local_78,&depth_local,(int *)&type_local,(int *)&rule_local,
             &local_38,(TypeOneDRule *)((long)&alpha_local + 4),anisotropic_weights,&beta_local,
             &local_50,&custom_filename,&this->llimits);
  ::std::unique_ptr<TasGrid::BaseCanonicalGrid,std::default_delete<TasGrid::BaseCanonicalGrid>>::
  operator=((unique_ptr<TasGrid::BaseCanonicalGrid,std::default_delete<TasGrid::BaseCanonicalGrid>>
             *)&this->base,&local_70);
  ::std::unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_>::~unique_ptr
            (&local_70);
  return;
}

Assistant:

void TasmanianSparseGrid::makeGlobalGrid(int dimensions, int outputs, int depth, TypeDepth type, TypeOneDRule rule, const std::vector<int> &anisotropic_weights, double alpha, double beta, const char* custom_filename, const std::vector<int> &level_limits){
    if (dimensions < 1) throw std::invalid_argument("ERROR: makeGlobalGrid() requires positive dimensions");
    if (outputs < 0) throw std::invalid_argument("ERROR: makeGlobalGrid() requires non-negative outputs");
    if (depth < 0) throw std::invalid_argument("ERROR: makeGlobalGrid() requires non-negative depth");
    if (!OneDimensionalMeta::isGlobal(rule)) throw std::invalid_argument("ERROR: makeGlobalGrid() requires a global rule");
    if ((rule == rule_customtabulated) && (custom_filename == 0)) throw std::invalid_argument("ERROR: makeGlobalGrid() with custom tabulated rule requires a filename");
    size_t expected_aw_size = (OneDimensionalMeta::isTypeCurved(type)) ? 2*dimensions : dimensions;
    if ((!anisotropic_weights.empty()) && (anisotropic_weights.size() != expected_aw_size)) throw std::invalid_argument("ERROR: makeGlobalGrid() requires anisotropic_weights with either 0 or dimenions entries");
    if ((!level_limits.empty()) && (level_limits.size() != (size_t) dimensions)) throw std::invalid_argument("ERROR: makeGlobalGrid() requires level_limits with either 0 or dimensions entries");
    clear();
    llimits = level_limits;
    base = Utils::make_unique<GridGlobal>(acceleration.get(), dimensions, outputs, depth, type, rule, anisotropic_weights, alpha, beta, custom_filename, llimits);
}